

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_value * VmNewOperandStack(jx9_vm *pVm,sxu32 nInstr)

{
  jx9_value *pjVar1;
  long lVar2;
  
  pjVar1 = (jx9_value *)SyMemBackendAlloc(&pVm->sAllocator,(nInstr + 0x10) * 0x40);
  if (pjVar1 != (jx9_value *)0x0) {
    for (lVar2 = (ulong)(nInstr + 0x10) << 6; lVar2 != 0; lVar2 = lVar2 + -0x40) {
      jx9MemObjInit(pVm,(jx9_value *)((long)&pjVar1[-1].x + lVar2));
    }
  }
  return pjVar1;
}

Assistant:

static jx9_value * VmNewOperandStack(
	jx9_vm *pVm, /* Target VM */
	sxu32 nInstr /* Total numer of generated bytecode instructions */
	)
{
	jx9_value *pStack;
  /* No instruction ever pushes more than a single element onto the
  ** stack and the stack never grows on successive executions of the
  ** same loop. So the total number of instructions is an upper bound
  ** on the maximum stack depth required.
  **
  ** Allocation all the stack space we will ever need.
  */
	nInstr += VM_STACK_GUARD;
	pStack = (jx9_value *)SyMemBackendAlloc(&pVm->sAllocator, nInstr * sizeof(jx9_value));
	if( pStack == 0 ){
		return 0;
	}
	/* Initialize the operand stack */
	while( nInstr > 0 ){
		jx9MemObjInit(&(*pVm), &pStack[nInstr - 1]);
		--nInstr;
	}
	/* Ready for bytecode execution */
	return pStack;
}